

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O0

bool __thiscall argvParser::analyzeConfigFile(argvParser *this,string *fileName)

{
  long lVar1;
  configFileReader *pcVar2;
  char **argv;
  argvParser *this_00;
  vector<char,_std::allocator<char>_> *pvVar3;
  bool bVar4;
  size_type sVar5;
  char *pcVar6;
  configFileReader *apcStack_150 [3];
  ulong local_138;
  char **local_130;
  configFileReader *local_128;
  vector<char,_std::allocator<char>_> *local_120;
  vector<char,_std::allocator<char>_> *local_118;
  allocator *local_110;
  configFileReader *local_108;
  string *local_100;
  argvParser *local_f8;
  string *local_f0;
  configFileReader *local_e8;
  int local_dc;
  size_type sStack_d8;
  int y;
  unsigned_long __vla_expr0;
  undefined1 local_c8 [8];
  string param;
  allocator local_a1;
  string local_a0 [32];
  vector<char,_std::allocator<char>_> *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arg;
  undefined1 local_55;
  string local_48 [32];
  configFileReader *local_28;
  configFileReader *reader;
  string *fileName_local;
  argvParser *this_local;
  
  apcStack_150[0] = (configFileReader *)0x10d04f;
  local_f8 = this;
  local_f0 = (string *)fileName;
  reader = (configFileReader *)fileName;
  fileName_local = (string *)this;
  local_e8 = (configFileReader *)operator_new(0x80);
  local_55 = 1;
  apcStack_150[0] = (configFileReader *)0x10d06a;
  std::__cxx11::string::string(local_48,local_f0);
  apcStack_150[0] = (configFileReader *)0x10d07c;
  configFileReader::configFileReader(local_e8,(string *)local_48);
  local_55 = 0;
  apcStack_150[0] = (configFileReader *)0x10d08b;
  std::__cxx11::string::~string(local_48);
  local_28 = local_e8;
  local_108 = local_e8;
  local_100 = (string *)&arg;
  apcStack_150[0] = (configFileReader *)0x10d0bf;
  std::__cxx11::string::string((string *)local_100,(string *)&local_f8->commentToken);
  apcStack_150[0] = (configFileReader *)0x10d0d2;
  configFileReader::setCommentChar(local_108,local_100);
  apcStack_150[0] = (configFileReader *)0x10d0dd;
  std::__cxx11::string::~string((string *)&arg);
  apcStack_150[0] = (configFileReader *)0x10d0e6;
  bVar4 = configFileReader::isEOF(local_28);
  if (bVar4) {
    apcStack_150[1] = local_28;
    if (local_28 != (configFileReader *)0x0) {
      apcStack_150[0] = (configFileReader *)0x10d396;
      configFileReader::~configFileReader(local_28);
      apcStack_150[0] = (configFileReader *)0x10d3a2;
      operator_delete(apcStack_150[1]);
    }
    this_local._7_1_ = false;
  }
  else {
    apcStack_150[0] = (configFileReader *)0x10d0f8;
    local_120 = (vector<char,_std::allocator<char>_> *)operator_new(0x18);
    *(undefined8 *)&(local_120->super__Vector_base<char,_std::allocator<char>_>)._M_impl = 0;
    *(pointer *)&(local_120->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x8 =
         (pointer)0x0;
    *(pointer *)&(local_120->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x10 =
         (pointer)0x0;
    apcStack_150[0] = (configFileReader *)0x10d115;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_120);
    local_80 = local_120;
    local_118 = local_120;
    local_110 = &local_a1;
    apcStack_150[0] = (configFileReader *)0x10d13e;
    std::allocator<char>::allocator();
    apcStack_150[0] = (configFileReader *)0x10d158;
    std::__cxx11::string::string(local_a0,"program Name",local_110);
    apcStack_150[0] = (configFileReader *)0x10d16d;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_118,(value_type *)local_a0);
    apcStack_150[0] = (configFileReader *)0x10d17b;
    std::__cxx11::string::~string(local_a0);
    apcStack_150[0] = (configFileReader *)0x10d187;
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    while( true ) {
      apcStack_150[0] = (configFileReader *)0x10d190;
      bVar4 = configFileReader::isEOF(local_28);
      if (((bVar4 ^ 0xffU) & 1) == 0) break;
      local_128 = (configFileReader *)local_c8;
      apcStack_150[0] = (configFileReader *)0x10d1b2;
      configFileReader::readUntilNextSeparator_abi_cxx11_(local_128);
      apcStack_150[0] = (configFileReader *)0x10d1c2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_80,&local_128->fileName);
      apcStack_150[0] = (configFileReader *)0x10d1d0;
      std::__cxx11::string::~string((string *)local_c8);
    }
    apcStack_150[0] = (configFileReader *)0x10d285;
    sStack_d8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_80);
    lVar1 = -(sStack_d8 * 8 + 0xf & 0xfffffffffffffff0);
    local_130 = (char **)((long)apcStack_150 + lVar1 + 8U);
    local_dc = 0;
    __vla_expr0 = (unsigned_long)(apcStack_150 + 1);
    while( true ) {
      pvVar3 = local_80;
      local_138 = (ulong)local_dc;
      *(undefined8 *)((long)apcStack_150 + lVar1) = 0x10d2d9;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)pvVar3);
      pvVar3 = local_80;
      if (sVar5 <= local_138) break;
      sVar5 = (size_type)local_dc;
      *(undefined8 *)((long)apcStack_150 + lVar1) = 0x10d2f8;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)pvVar3,sVar5);
      *(undefined8 *)((long)apcStack_150 + lVar1) = 0x10d300;
      pcVar6 = (char *)std::__cxx11::string::c_str();
      local_130[local_dc] = pcVar6;
      local_dc = local_dc + 1;
    }
    *(undefined8 *)((long)apcStack_150 + lVar1) = 0x10d32f;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)pvVar3);
    this_00 = local_f8;
    argv = local_130;
    *(undefined8 *)((long)apcStack_150 + lVar1) = 0x10d344;
    analyseArgv(this_00,(int)sVar5,argv);
    pcVar2 = local_28;
    apcStack_150[2] = local_28;
    if (local_28 != (configFileReader *)0x0) {
      *(undefined8 *)((long)apcStack_150 + lVar1) = 0x10d361;
      configFileReader::~configFileReader(pcVar2);
      pcVar2 = apcStack_150[2];
      *(undefined8 *)((long)apcStack_150 + lVar1) = 0x10d36d;
      operator_delete(pcVar2);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool argvParser::analyzeConfigFile(string fileName) {
    configFileReader *reader = new configFileReader(fileName);
    reader->setCommentChar(commentToken);
    if (!reader->isEOF()) {
        vector<string> *arg = new vector<string>();
        arg->push_back("program Name");
        while (!reader->isEOF()) {
            string param = reader->readUntilNextSeparator();
            arg->push_back(param);
        }
        char *buff[arg->size()];
        for (int y = 0; y < arg->size(); y++) {
            buff[y] = const_cast<char *>(arg->at(y).c_str());
        }
        analyseArgv(arg->size(), buff);
        delete reader;
    } else {
        delete reader;
        return false;
    }
    return true;
}